

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

float dx(qnode_ptr_t p,qnode_ptr_t q,int x,int y,int z)

{
  int h_00;
  int iVar1;
  int local_2c;
  int h;
  int i;
  float d;
  int z_local;
  int y_local;
  int x_local;
  qnode_ptr_t q_local;
  qnode_ptr_t p_local;
  
  h_00 = C.m / 2;
  h = 0;
  iVar1 = overflow(x,y,p->sizy,p->sizx,p->ofst,h_00,1);
  if (iVar1 == 0) {
    (*q->param_ptr[z])[p->res * x + y].err = 0;
    for (local_2c = -h_00; local_2c <= h_00; local_2c = local_2c + 1) {
      h = (int)((*p->gauss_ptr[z])[p->res * (x + local_2c) + y] * C.k[local_2c + h_00] + (float)h);
    }
    h = (int)((float)h / C.f);
  }
  else {
    (*q->param_ptr[z])[q->res * x + y].err = 1;
  }
  return (float)h;
}

Assistant:

float dx(p,q,x,y,z)
qnode_ptr_t p, q ;
int x, y, z ;

{ extern kernel_t C ;
  float d ;
  int i, h ;

  h = C.m/2 ;
  d = 0.0 ;

  if (overflow(x,y,p->sizy,p->sizx,p->ofst,h,1)) {
    (*q->param_ptr[z])[q->res*x + y].err = SA_OVERFLOW ;
  }
  else {
    (*q->param_ptr[z])[p->res*x + y].err = NO_ERROR ;
    for (i = -h ; i <= h ; i++) {
      d += (*p->gauss_ptr[z])[p->res*(x+i) + y]*C.k[i+h] ;
    }
    d /= C.f ;
  }
  return(d) ;
}